

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chardev.c
# Opt level: O2

LispPTR CHAR_closefile(LispPTR *args)

{
  uint LAddr;
  int iVar1;
  LispPTR *pLVar2;
  int *piVar3;
  LispPTR LVar4;
  
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[1]);
  LAddr = *args;
  if ((LAddr & 0xfff0000) == 0xf0000) {
    LVar4 = LAddr | 0xffff0000;
  }
  else if ((LAddr & 0xfff0000) == 0xe0000) {
    LVar4 = LAddr & 0xffff;
  }
  else {
    pLVar2 = NativeAligned4FromLAddr(LAddr);
    LVar4 = *pLVar2;
  }
  iVar1 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar1 == 0) {
    alarm(TIMEOUT_TIME);
    piVar3 = __errno_location();
    do {
      *piVar3 = 0;
      iVar1 = close(LVar4);
      if (iVar1 != -1) {
        alarm(0);
        goto LAB_00110bf3;
      }
    } while (*piVar3 == 4);
    LVar4 = 0;
    alarm(0);
    if (*piVar3 == 1) {
LAB_00110bf3:
      LVar4 = 0x4c;
    }
    else {
      err_mess("close",*piVar3);
      *Lisp_errno = *piVar3;
    }
  }
  else {
    *Lisp_errno = 100;
    LVar4 = 0;
  }
  return LVar4;
}

Assistant:

LispPTR CHAR_closefile(LispPTR *args)
/* args[0]            fd      */
/* args[1]            errno   */
{
#ifndef DOS
  int fd; /* file descriptor */
  int rval;
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[1]);
  fd = LispNumToCInt(args[0]);
  ERRSETJMP(NIL);
  TIMEOUT(rval = close(fd));
  if (rval == -1) {
    /** This if is a patch for an apparent problem **/
    /** in SunOS 4 that causes a close on /dev/ttya **/
    /** to error with 'not owner' **/
    if (errno == 1) {
      DBPRINT(("Got errno 1 on a CLOSE!"));
      return (ATOM_T);
    }
    DBPRINT(("Closing char device descriptor #%d.\n", fd));
    err_mess("close", errno);
    *Lisp_errno = errno;
    return (NIL);
  }
  return (ATOM_T);
#endif /* DOS */
}